

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O3

void __thiscall sznet::net::Acceptor::handleRead(Acceptor *this)

{
  EventLoop *this_00;
  bool bVar1;
  int iVar2;
  socklen_t *__addr_len;
  sockaddr *__addr;
  SourceFile file;
  Logger local_1008;
  undefined1 local_34 [8];
  InetAddress peerAddr;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  __addr_len = (socklen_t *)0x0;
  InetAddress::InetAddress((InetAddress *)local_34,0,false,false);
  local_1008.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ =
       Socket::accept(&this->m_acceptSocket,(int)(InetAddress *)local_34,__addr,__addr_len);
  if ((int)local_1008.m_impl.m_time.m_microSecondsSinceEpoch < 0) {
    file._8_8_ = 0xc;
    file.m_data = "Acceptor.cpp";
    Logger::Logger(&local_1008,file,0x50,false);
    if (0x17 < (uint)(((int)&local_1008 + 0xfb0) - (int)local_1008.m_impl.m_stream.m_buffer.m_cur))
    {
      builtin_strncpy(local_1008.m_impl.m_stream.m_buffer.m_cur,"in Acceptor::handleRead",0x17);
      local_1008.m_impl.m_stream.m_buffer.m_cur = local_1008.m_impl.m_stream.m_buffer.m_cur + 0x17;
    }
    Logger::~Logger(&local_1008);
    iVar2 = sz_getlasterr();
    if (iVar2 == 0x18) {
      sockets::sz_closesocket(this->m_idleFd);
      iVar2 = accept((this->m_acceptSocket).m_sockfd,(sockaddr *)0x0,(socklen_t *)0x0);
      this->m_idleFd = iVar2;
      sockets::sz_closesocket(iVar2);
      iVar2 = sz_open("/dev/null",0x80000);
      this->m_idleFd = iVar2;
    }
  }
  else if ((this->m_newConnectionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    sockets::sz_closesocket((int)local_1008.m_impl.m_time.m_microSecondsSinceEpoch);
  }
  else {
    (*(this->m_newConnectionCallback)._M_invoker)
              ((_Any_data *)&this->m_newConnectionCallback,(int *)&local_1008,
               (InetAddress *)local_34);
  }
  return;
}

Assistant:

void Acceptor::handleRead()
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr;
	// FIXME loop until no more
	sockets::sz_sock connfd = m_acceptSocket.accept(&peerAddr);
	if (connfd >= 0)
	{
		// string hostport = peerAddr.toIpPort();
		// LOG_TRACE << "Accepts of " << hostport;
		if (m_newConnectionCallback)
		{
			m_newConnectionCallback(connfd, peerAddr);
		}
		else
		{
			// û�лص��������ر�client��Ӧ��fd
			sockets::sz_closesocket(connfd);
		}
	}
	// �����׽���ʧ��
	else
	{
		LOG_SYSERR << "in Acceptor::handleRead";
		// ���صĴ�����ΪEMFILE����������������
		if (sz_getlasterr() == sz_err_emfile)
		{
			// ��ֹbusy loop
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = ::accept(m_acceptSocket.fd(), nullptr, nullptr);
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = createNullFileFd();
		}
	}
}